

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int av1_pack_bitstream(AV1_COMP *cpi,uint8_t *dst,size_t dst_size,size_t *size,int *largest_tile_id)

{
  byte *__dest;
  FRAME_TYPE FVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  aom_metadata_t *paVar5;
  TileDataEnc *pTVar6;
  undefined6 uVar7;
  byte bVar8;
  uint32_t uVar9;
  int iVar10;
  aom_metadata_insert_flags_t aVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uchar *mem;
  size_t sVar17;
  aom_metadata_insert_flags_t aVar18;
  uint uVar19;
  AV1_PRIMARY *pAVar20;
  byte *pbVar21;
  uint uVar22;
  ulong uVar23;
  AV1_PRIMARY *pAVar24;
  aom_metadata_array_t *paVar25;
  uchar *mem_1;
  long lVar26;
  size_t *psVar27;
  AV1_PRIMARY *pAVar28;
  int iVar29;
  uint64_t value;
  uint uVar30;
  size_t *psVar31;
  size_t cur_tile_size;
  AV1_COMP *pAVar32;
  uint8_t *puVar33;
  aom_metadata_array_t *paVar34;
  size_t move_size;
  size_t move_size_1;
  ulong uVar35;
  long lVar36;
  bool bVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  uint32_t total_size;
  AV1_COMP *pAStack_101a8;
  uint uStack_1019c;
  size_t *psStack_10198;
  size_t *psStack_10190;
  byte *pbStack_10188;
  undefined8 uStack_10180;
  size_t *psStack_10178;
  aom_metadata_array_t *paStack_10170;
  ThreadData_conflict *pTStack_10168;
  AV1_PRIMARY *pAStack_10160;
  uint uStack_10154;
  uint32_t obu_header_size;
  uint max_tile_size;
  MACROBLOCKD *pMStack_10148;
  size_t *psStack_10140;
  aom_write_bit_buffer aStack_10138;
  uint *puStack_10120;
  ulong uStack_10118;
  uint8_t *puStack_10110;
  AV1_PRIMARY *pAStack_10108;
  ThreadData_conflict *pTStack_10100;
  size_t *psStack_100f8;
  long lStack_100f0;
  long lStack_100e8;
  uint32_t uStack_100e0;
  uint uStack_100dc;
  CommonTileParams *pCStack_100d8;
  TileInfo tile_info;
  FrameHeaderInfo fh_info;
  int iStack_100a0;
  int unused;
  int tile_size_bytes_1;
  int tile_size_bytes;
  uint uStack_1006c;
  byte bStack_10040;
  size_t coded_obu_size;
  uint8_t *puStack_10030;
  uint uStack_10028;
  undefined4 uStack_10024;
  uint32_t *puStack_10020;
  size_t *psStack_10018;
  size_t *psStack_10010;
  uint8_t local_10000;
  undefined8 local_fffc;
  int local_fff0;
  int local_ffec;
  uint local_ffe8;
  int local_ffe4;
  
  pAStack_10160 = cpi->ppi;
  fh_info.frame_header = (uint8_t *)0x0;
  fh_info.obu_header_byte_offset = 0;
  fh_info.total_length = 0;
  if (((cpi->common).delta_q_info.delta_q_present_flag != 0) && (cpi->deltaq_used == 0)) {
    (cpi->common).delta_q_info.delta_q_present_flag = 0;
  }
  iVar12 = (cpi->common).temporal_layer_id;
  iVar14 = (cpi->common).spatial_layer_id;
  cpi->frame_header_count = 0;
  puStack_10110 = dst;
  pAStack_101a8 = cpi;
  puStack_10120 = (uint *)largest_tile_id;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    if (dst_size < 2) {
      return 1;
    }
    *dst = '\n';
    puVar33 = dst + 1;
    psStack_10198 = (size_t *)dst_size;
    uVar9 = av1_write_sequence_header_obu((cpi->common).seq_params,puVar33,dst_size);
    psVar27 = (size_t *)(ulong)uVar9;
    sVar17 = aom_uleb_size_in_bytes((uint64_t)psVar27);
    psStack_10190 = (size_t *)(sVar17 + 1);
    if (psStack_10198 < psVar27) {
      return 1;
    }
    if ((size_t *)((long)psStack_10198 - (long)psVar27) < psStack_10190 || psStack_10198 == psVar27)
    {
      return 1;
    }
    memmove(puStack_10110 + (long)psStack_10190,puVar33,(size_t)psVar27);
    if (sVar17 == 0) {
      return 1;
    }
    coded_obu_size = 0;
    iVar10 = aom_uleb_encode((uint64_t)psVar27,sVar17,puVar33,&coded_obu_size);
    if (iVar10 != 0) {
      return 1;
    }
    if (coded_obu_size != sVar17) {
      return 1;
    }
    dst = puStack_10110 + (long)psStack_10190 + (long)psVar27;
    dst_size = (long)psStack_10198 - (long)((long)psStack_10190 + (long)psVar27);
  }
  uStack_1019c = iVar14 << 3 | iVar12 << 5;
  pTStack_10168 = (ThreadData_conflict *)&pAStack_101a8->common;
  pAVar32 = pAStack_101a8;
  if ((pAStack_101a8->common).show_frame != 0) {
    if (((pAStack_101a8->source == (YV12_BUFFER_CONFIG *)0x0) ||
        (paVar25 = pAStack_101a8->source->metadata, paVar25 == (aom_metadata_array_t *)0x0)) ||
       (paVar25->sz == 0)) {
      pbStack_10188 = (byte *)0x0;
    }
    else {
      uVar23 = 0;
      pbStack_10188 = (byte *)0x0;
      psVar27 = (size_t *)dst;
      psStack_10198 = (size_t *)dst_size;
      psStack_10190 = (size_t *)dst_size;
      psStack_10178 = (size_t *)dst;
      paStack_10170 = paVar25;
      do {
        paVar5 = paVar25->metadata_array[uVar23];
        pAVar32 = pAStack_101a8;
        if ((paVar5 != (aom_metadata_t *)0x0) && (paVar5->payload != (uint8_t *)0x0)) {
          aVar11 = paVar5->insert_flag;
          aVar18 = aVar11 & 0xf;
          FVar1 = *(FRAME_TYPE *)&(pTStack_10168->mb).plane[0].src_diff;
          if (((FVar1 == '\0') && (aVar18 == AOM_MIF_KEY_FRAME)) ||
             (aVar18 == AOM_MIF_ANY_FRAME || aVar18 == AOM_MIF_NON_KEY_FRAME && FVar1 != '\0')) {
            if (psStack_10190 < (size_t *)0x2) {
              aom_internal_error((pAStack_101a8->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
              aVar11 = paVar5->insert_flag;
            }
            bVar8 = (byte)((aVar11 & AOM_MIF_NON_KEY_FRAME_LAYER_SPECIFIC) >> 4) &
                    ((pAStack_101a8->common).seq_params)->has_nonzero_operating_point_idc;
            *(byte *)psVar27 = bVar8 * '\x04' | 0x2a;
            psVar31 = (size_t *)0x1;
            if (bVar8 == 1) {
              *(byte *)((long)psVar27 + 1) = 0;
              psVar31 = (size_t *)0x2;
            }
            pbVar21 = (byte *)((long)psVar27 + (long)psVar31);
            uVar35 = (long)psStack_10190 - (long)psVar31;
            coded_obu_size = 0;
            psStack_10140 = psVar27;
            iVar12 = aom_uleb_encode((ulong)paVar5->type,uVar35,pbVar21,&coded_obu_size);
            uStack_10180 = pbVar21;
            if ((iVar12 == 0) && (paVar5->sz + coded_obu_size + 1 <= uVar35)) {
              __dest = pbVar21 + coded_obu_size;
              lVar26 = coded_obu_size + 1;
              memcpy(__dest,paVar5->payload,paVar5->sz);
              __dest[paVar5->sz] = 0x80;
              psVar27 = (size_t *)(lVar26 + paVar5->sz);
              if (psVar27 == (size_t *)0x0) goto LAB_00196905;
              sVar17 = aom_uleb_size_in_bytes((uint64_t)psVar27);
              pAVar32 = pAStack_101a8;
              if (((psVar27 <= psStack_10190) &&
                  (psVar31 <= (size_t *)((long)psStack_10190 - (long)psVar27))) &&
                 ((size_t *)(sVar17 + (long)psVar31) <=
                  (size_t *)((long)psStack_10190 - (long)psVar27))) {
                memmove((byte *)((long)(sVar17 + (long)psVar31) + (long)psStack_10140),pbVar21,
                        (size_t)psVar27);
                goto LAB_0019694e;
              }
LAB_00196995:
              aom_internal_error((pAVar32->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
              coded_obu_size = 0;
              iVar12 = aom_uleb_encode((uint64_t)psVar27,0,uStack_10180,&coded_obu_size);
              if ((iVar12 != 0) || (sVar17 = 0, coded_obu_size != 0)) {
LAB_00196a16:
                aom_internal_error((pAVar32->common).error,AOM_CODEC_ERROR,
                                   "av1_write_metadata_array: output buffer full");
                paVar25 = paStack_10170;
                dst = (uint8_t *)psStack_10178;
                dst_size = (size_t)psStack_10198;
                psVar27 = psStack_10140;
                goto LAB_001968f4;
              }
            }
            else {
LAB_00196905:
              pAVar32 = pAStack_101a8;
              aom_internal_error((pAStack_101a8->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
              sVar17 = aom_uleb_size_in_bytes(0);
              psVar27 = (size_t *)0x0;
              if (psStack_10190 < (size_t *)(sVar17 + (long)psVar31) || psStack_10190 < psVar31)
              goto LAB_00196995;
LAB_0019694e:
              if (sVar17 == 0) goto LAB_00196995;
              coded_obu_size = 0;
              iVar12 = aom_uleb_encode((uint64_t)psVar27,sVar17,uStack_10180,&coded_obu_size);
              if ((iVar12 != 0) || (coded_obu_size != sVar17)) goto LAB_00196a16;
            }
            pbVar21 = (byte *)((long)psVar27 + (long)psVar31) + sVar17;
            psVar27 = (size_t *)((long)psStack_10140 + (long)pbVar21);
            psStack_10190 = (size_t *)((long)psStack_10190 - (long)pbVar21);
            pbStack_10188 = pbStack_10188 + (long)pbVar21;
            paVar25 = paStack_10170;
            dst = (uint8_t *)psStack_10178;
            dst_size = (size_t)psStack_10198;
          }
        }
LAB_001968f4:
        uVar23 = uVar23 + 1;
      } while (uVar23 < paVar25->sz);
    }
    dst = (uint8_t *)((long)dst + (long)pbStack_10188);
    dst_size = dst_size - (long)pbStack_10188;
  }
  if (1 < pAVar32->num_tg) goto LAB_00196ace;
  if ((pAVar32->common).show_existing_frame == 0) {
    aStack_10138.bit_buffer = (uint8_t *)0x0;
    aStack_10138.bit_offset = 0;
    aStack_10138._12_4_ = 0;
    sVar17 = 0;
  }
  else {
    if ((pAVar32->common).features.error_resilient_mode == false) {
LAB_00196ace:
      aStack_10138.bit_offset = 0;
      aStack_10138._12_4_ = 0;
      aStack_10138.bit_buffer = (uint8_t *)0x0;
      if (dst_size < (size_t *)0x2) {
        return 1;
      }
      _Var2 = ((pAVar32->common).seq_params)->has_nonzero_operating_point_idc;
      if ((pAStack_10160->level_params).keep_level_stats != 0) {
        pAVar32->frame_header_count = pAVar32->frame_header_count + 1;
      }
      *dst = _Var2 * '\x04' | 0x1a;
      uVar23 = 1;
      if (_Var2 != false) {
        *(byte *)((long)dst + 1) = (byte)uStack_1019c;
        uVar23 = 2;
      }
      pbVar21 = (byte *)((long)dst + uVar23);
      psStack_10178 = (size_t *)dst;
      fh_info.frame_header = dst;
      uVar9 = write_frame_header_obu(pAVar32,&(pAVar32->td).mb.e_mbd,&aStack_10138,pbVar21,1);
      psVar27 = (size_t *)(ulong)uVar9;
      sVar17 = aom_uleb_size_in_bytes((uint64_t)psVar27);
      if (dst_size < psVar27) {
        return 1;
      }
      if (dst_size - (long)psVar27 < uVar23) {
        return 1;
      }
      uVar23 = uVar23 + sVar17;
      if (dst_size - (long)psVar27 < uVar23) {
        return 1;
      }
      memmove((byte *)((long)psStack_10178 + uVar23),pbVar21,(size_t)psVar27);
      if (sVar17 == 0) {
        return 1;
      }
      coded_obu_size = 0;
      iVar12 = aom_uleb_encode((uint64_t)psVar27,sVar17,pbVar21,&coded_obu_size);
      if (iVar12 != 0) {
        return 1;
      }
      if (coded_obu_size != sVar17) {
        return 1;
      }
      fh_info.obu_header_byte_offset = 0;
      fh_info.total_length = uVar23 + (long)psVar27;
      if (fh_info.total_length >> 0x20 != 0) {
        return 1;
      }
      dst = (uint8_t *)((long)psStack_10178 + fh_info.total_length);
      pAVar32 = pAStack_101a8;
      if ((pAStack_101a8->common).show_existing_frame == 0) goto LAB_00196c26;
    }
    else {
      aStack_10138.bit_buffer = (uint8_t *)0x0;
      aStack_10138.bit_offset = 0;
      aStack_10138._12_4_ = 0;
      if (*(FRAME_TYPE *)&(pTStack_10168->mb).plane[0].src_diff == '\0') goto LAB_00196ace;
      sVar17 = 0;
    }
    if (((pAVar32->common).features.error_resilient_mode != true) ||
       (*(FRAME_TYPE *)&(pTStack_10168->mb).plane[0].src_diff == '\0')) goto LAB_00197848;
  }
LAB_00196c26:
  if (aStack_10138.bit_buffer != (uint8_t *)0x0) {
    aStack_10138.bit_buffer = aStack_10138.bit_buffer + sVar17;
  }
  *puStack_10120 = 0;
  if (((pAVar32->common).seg.enabled != '\0') && ((pAVar32->common).seg.update_map != '\0')) {
    if ((pAVar32->common).features.primary_ref_frame == 7) {
      bVar37 = false;
    }
    else {
      bVar37 = (pAVar32->td).rd_counts.seg_tmp_pred_cost[1] <=
               (pAVar32->td).rd_counts.seg_tmp_pred_cost[0];
    }
    (pAVar32->common).seg.temporal_update = bVar37;
  }
  pCStack_100d8 = &(pAVar32->common).tiles;
  psStack_10178 = (size_t *)dst;
  if ((pAVar32->common).tiles.large_scale == 0) {
    total_size = 0;
    max_tile_size = 0;
    obu_header_size = 0;
    uVar13 = (pAVar32->common).tiles.cols;
    paVar25 = (aom_metadata_array_t *)(ulong)uVar13;
    uVar3 = (pAVar32->common).tiles.rows;
    pAStack_10108 = (AV1_PRIMARY *)(ulong)uVar3;
    uVar13 = uVar3 * uVar13;
    uVar23 = (ulong)uVar13;
    psStack_100f8 = (size_t *)dst;
    if ((pAVar32->mt_info).pack_bs_mt_enabled == true) {
      uVar16 = (pAVar32->mt_info).num_mod_workers[9];
      if ((int)uVar13 < 1) {
        fVar39 = 0.0;
      }
      else {
        lVar26 = 0;
        uVar35 = 0;
        do {
          uVar35 = uVar35 + *(long *)((long)pAVar32->tile_data->inter_mode_rd_models +
                                     lVar26 + -0x10);
          lVar26 = lVar26 + 0x5d10;
        } while (uVar23 * 0x5d10 - lVar26 != 0);
        if ((long)uVar35 < 0) {
          fVar39 = (float)uVar35;
        }
        else {
          fVar39 = (float)(long)uVar35;
        }
      }
      if ((int)uVar16 < 2) goto LAB_001973db;
      fVar40 = 0.0;
      uVar15 = 1;
      do {
        fVar41 = (float)(int)uVar16;
        fVar41 = (fVar41 * -5.0 + ((float)(int)(uVar16 - 1) / fVar41) * fVar39) -
                 (float)(int)uVar13 / fVar41;
        uVar19 = uVar16;
        if (fVar41 <= fVar40) {
          fVar41 = fVar40;
          uVar19 = uVar15;
        }
        fVar40 = fVar41;
        bVar37 = 2 < uVar16;
        uVar16 = uVar16 - 1;
        uVar15 = uVar19;
      } while (bVar37);
      if (uVar19 < 2) goto LAB_001973db;
      av1_write_tile_obu_mt
                (pAVar32,dst,&total_size,&aStack_10138,(byte)uStack_1019c,&fh_info,
                 (int *)puStack_10120,&max_tile_size,&obu_header_size,(uint8_t **)&psStack_100f8,
                 uVar19);
    }
    else {
LAB_001973db:
      pTStack_10168 = &pAVar32->td;
      pbStack_10188 =
           (byte *)CONCAT44(pbStack_10188._4_4_,
                            (int)(pAVar32->num_tg + uVar13 + -1) / pAVar32->num_tg);
      uVar35 = 0;
      _tile_size_bytes = 0;
      tile_info.mi_row_start = 1;
      (pAVar32->td).interp_filter_selected[2] = 0;
      (pAVar32->td).interp_filter_selected[3] = 0;
      (pAVar32->td).coefficient_size = 0;
      (pAVar32->td).max_mv_magnitude = 0;
      (pAVar32->td).interp_filter_selected[0] = 0;
      (pAVar32->td).interp_filter_selected[1] = 0;
      uStack_10118 = uVar23;
      if (0 < (int)uVar3) {
        pMStack_10148 = &(pAStack_101a8->td).mb.e_mbd;
        lStack_100e8 = (long)paVar25 * 0x5d10;
        lStack_100f0 = -(ulong)(uVar13 - 1);
        lVar26 = 0x20;
        lVar36 = 0;
        uStack_10180 = (byte *)0x0;
        iVar14 = 0;
        iVar12 = 1;
        psVar27 = (size_t *)dst;
        paStack_10170 = paVar25;
        do {
          pTStack_10100 = (ThreadData_conflict *)lVar26;
          if (0 < (int)paVar25) {
            pAStack_10160 = (AV1_PRIMARY *)(lStack_100f0 + lVar36);
            paVar34 = (aom_metadata_array_t *)0x0;
            do {
              pAVar32 = pAStack_101a8;
              iVar14 = iVar14 + 1;
              if (iVar12 != 0) {
                iVar14 = 1;
              }
              psStack_10190 = (size_t *)CONCAT44(psStack_10190._4_4_,iVar14);
              bVar37 = iVar14 == (int)pbStack_10188;
              bVar38 = (long)&paVar34->sz + (long)pAStack_10160 == 0;
              psStack_10198 = (size_t *)(uVar35 + (long)dst);
              if (iVar12 == 0) {
                psStack_10198 = psVar27;
              }
              (pAStack_101a8->td).mb.e_mbd.tile_ctx =
                   (FRAME_CONTEXT *)
                   ((long)((pAStack_101a8->tile_data->tctx).txb_skip_cdf + -1) + 0x2e + lVar26);
              local_ffe8 = (uint)(bVar38 || bVar37);
              psStack_10140 = (size_t *)CONCAT44(psStack_10140._4_4_,local_ffe8);
              local_10000 = (uint8_t)uStack_1019c;
              local_fffc._0_4_ = 0;
              local_fffc._4_4_ = 0;
              coded_obu_size = (size_t)&aStack_10138;
              iVar14 = (int)paVar34;
              local_fff0 = (int)uStack_10180;
              puStack_10020 = &total_size;
              psStack_10018 = (size_t *)dst;
              psStack_10010 = psStack_10198;
              local_ffec = iVar14;
              local_ffe4 = iVar12;
              if (iVar12 == 0) {
                av1_pack_tile_info(pAStack_101a8,pTStack_10168,(PackBSParams *)&coded_obu_size);
              }
              else {
                av1_write_obu_tg_tile_headers
                          (pAStack_101a8,pMStack_10148,(PackBSParams *)&coded_obu_size,
                           (int)lVar36 + iVar14);
                av1_pack_tile_info(pAVar32,pTStack_10168,(PackBSParams *)&coded_obu_size);
                _tile_size_bytes = (ulong)local_fffc._4_4_;
                psStack_100f8 = (size_t *)((long)psStack_100f8 + _tile_size_bytes);
                obu_header_size = (uint32_t)local_fffc;
              }
              paVar25 = paStack_10170;
              psVar27 = psStack_10198;
              uVar23 = CONCAT44(uStack_10024,uStack_10028);
              _tile_size_bytes = _tile_size_bytes + (ulong)(!bVar38 && !bVar37) * 4 + uVar23;
              if (max_tile_size < uVar23) {
                *puStack_10120 = (int)lVar36 + iVar14;
                max_tile_size = uStack_10028;
              }
              iVar12 = (int)psStack_10140;
              if ((int)psStack_10140 != 0) {
                av1_write_last_tile_info
                          (pAStack_101a8,&fh_info,&aStack_10138,(size_t *)&tile_size_bytes,
                           (uint8_t *)psStack_10198,&total_size,(uint8_t **)&psStack_100f8,
                           (int *)puStack_10120,&tile_info.mi_row_start,obu_header_size,
                           (byte)uStack_1019c);
                uVar23 = CONCAT44(uStack_10024,uStack_10028);
              }
              total_size = (int)uVar23 + total_size;
              uVar35 = (ulong)total_size;
              paVar34 = (aom_metadata_array_t *)((long)&paVar34->sz + 1);
              lVar26 = lVar26 + 0x5d10;
              dst = (uint8_t *)psStack_10178;
              iVar14 = (int)psStack_10190;
            } while (paVar25 != paVar34);
          }
          uStack_10180 = uStack_10180 + 1;
          lVar36 = (long)&paVar25->sz + lVar36;
          lVar26 = (long)pTStack_10100 + lStack_100e8;
        } while ((AV1_PRIMARY *)uStack_10180 != pAStack_10108);
      }
      pAVar32 = pAStack_101a8;
      av1_accumulate_pack_bs_thread_data(pAStack_101a8,pTStack_10168);
      uVar13 = (uint)uStack_10118;
    }
    psVar27 = psStack_100f8;
    uVar3 = max_tile_size;
    uVar9 = obu_header_size;
    if (1 < (int)uVar13) {
      uVar23 = (ulong)obu_header_size;
      aom_wb_overwrite_literal
                (&aStack_10138,*puStack_10120,
                 (pAVar32->common).tiles.log2_rows + (pAVar32->common).tiles.log2_cols);
      psVar31 = psStack_10178;
      if (pAVar32->num_tg == 1) {
        tile_size_bytes_1 = 4;
        iVar14 = (int)psVar27 - (int)psStack_10178;
        iVar12 = remux_tiles(pCStack_100d8,(uint8_t *)psVar27,total_size - iVar14,uVar3,0,
                             &tile_size_bytes_1,&unused);
        total_size = iVar12 + iVar14;
        aom_wb_overwrite_literal(&aStack_10138,tile_size_bytes_1 + -1,2);
        aom_uleb_decode((byte *)(uVar23 + (long)psVar31),(ulong)(total_size - uVar9),&coded_obu_size
                        ,(size_t *)&tile_size_bytes);
        value = (total_size - uVar9) - _tile_size_bytes;
        if (value != coded_obu_size) {
          aom_uleb_encode(value,_tile_size_bytes,(byte *)(uVar23 + (long)psVar31),
                          (size_t *)&tile_info);
          uVar35 = _tile_size_bytes;
          iVar12 = tile_info.mi_row_start;
          if (CONCAT44(tile_info.mi_row_end,tile_info.mi_row_start) < _tile_size_bytes) {
            memmove((byte *)((long)psStack_10178 +
                            uVar23 + CONCAT44(tile_info.mi_row_end,tile_info.mi_row_start)),
                    (byte *)((long)psStack_10178 + uVar23 + _tile_size_bytes),coded_obu_size);
            total_size = total_size + (iVar12 - (int)uVar35);
          }
        }
      }
    }
  }
  else {
    iVar12 = (pAVar32->common).tiles.rows;
    _Var2 = ((pAVar32->common).seq_params)->has_nonzero_operating_point_idc;
    if ((pAVar32->ppi->level_params).keep_level_stats != 0) {
      pAVar32->frame_header_count = pAVar32->frame_header_count + 1;
    }
    pMStack_10148 =
         (MACROBLOCKD *)CONCAT44(pMStack_10148._4_4_,iVar12 * (pAVar32->common).tiles.cols);
    *dst = _Var2 * '\x04' | 0x32;
    lVar26 = 1;
    if (_Var2 != false) {
      *(byte *)((long)dst + 1) = (byte)uStack_1019c;
      lVar26 = 2;
    }
    pbVar21 = (byte *)((long)dst + lVar26);
    uVar13 = write_frame_header_obu(pAVar32,&(pAVar32->td).mb.e_mbd,&aStack_10138,pbVar21,0);
    if ((pAVar32->oxcf).tile_cfg.enable_ext_tile_debug == true) {
      puStack_10030 = (uint8_t *)0x0;
      uStack_10028 = 0;
      uVar3 = (pAVar32->common).current_frame.frame_number;
      coded_obu_size._0_5_ = CONCAT14((char)(uVar3 / 100) + '0',0x68662f2e);
      uVar7 = CONCAT15((char)((uVar3 % 100) / 10),(undefined5)coded_obu_size);
      coded_obu_size =
           (size_t)(CONCAT16((char)uVar3 + (char)(uVar3 / 10) * -10,uVar7) | 0x30300000000000);
      av1_print_uncompressed_frame_header(pbVar21,uVar13,(char *)&coded_obu_size);
    }
    iVar12 = (pAVar32->common).tiles.cols;
    pAVar20 = (AV1_PRIMARY *)(long)iVar12;
    pTStack_10100 = &pAVar32->td;
    uVar3 = (pAVar32->common).tiles.rows;
    (pAVar32->td).coefficient_size = 0;
    (pAVar32->td).max_mv_magnitude = 0;
    (pAVar32->td).interp_filter_selected[0] = 0;
    (pAVar32->td).interp_filter_selected[1] = 0;
    (pAVar32->td).interp_filter_selected[2] = 0;
    (pAVar32->td).interp_filter_selected[3] = 0;
    paStack_10170 = (aom_metadata_array_t *)pbVar21;
    uStack_100e0 = uVar13;
    if ((long)pAVar20 < 1) {
      uStack_10154 = 0;
      uStack_10180 = (byte *)((ulong)uStack_10180._4_4_ << 0x20);
    }
    else {
      pAVar28 = (AV1_PRIMARY *)(ulong)(iVar12 - 1);
      psStack_10140 = (size_t *)((ulong)(1 < (int)pMStack_10148) << 2);
      lStack_100e8 = (ulong)uVar3 << 10;
      lStack_100f0 = (long)pAVar20 * 0x5d10;
      psStack_10198 = &coded_obu_size;
      uVar23 = 0x20;
      uStack_10154 = 0;
      uStack_10180 = (byte *)((ulong)uStack_10180._4_4_ << 0x20);
      pAVar24 = (AV1_PRIMARY *)0x0;
      uVar16 = uVar13;
      pAStack_10108 = pAVar20;
      do {
        av1_tile_set_col(&tile_info,(AV1_COMMON *)pTStack_10168,(int)pAVar24);
        uVar13 = uVar16 + 4;
        if (pAVar24 == pAVar28) {
          uVar13 = uVar16;
        }
        pAStack_10160 = pAVar24;
        uStack_10118 = uVar23;
        if (0 < (int)uVar3) {
          pbVar21 = (byte *)0xffffffff;
          uVar35 = (ulong)pAVar24 & 0xffffffff;
          lVar36 = 0;
          do {
            iVar12 = (int)pbVar21 + 1;
            pTVar6 = pAStack_101a8->tile_data;
            psStack_10190 = (size_t *)CONCAT44(psStack_10190._4_4_,iVar12);
            pbStack_10188 = pbVar21;
            av1_tile_set_row(&tile_info,(AV1_COMMON *)pTStack_10168,iVar12);
            pAVar32 = pAStack_101a8;
            pbVar21 = (byte *)((long)paStack_10170 + (ulong)uVar13);
            *(byte **)((long)psStack_10198 + lVar36) = pbVar21;
            (pAStack_101a8->td).mb.e_mbd.tile_ctx =
                 (FRAME_CONTEXT *)((long)((pTVar6->tctx).txb_skip_cdf + -1) + 0x2e + uVar23);
            uStack_1019c = (uint)uVar35;
            if ((pAStack_101a8->common).tiles.large_scale == 0) {
              bStack_10040 = (pAStack_101a8->common).features.disable_cdf_update ^ 1;
            }
            else {
              bStack_10040 = 0;
            }
            aom_start_encode((aom_writer *)&tile_size_bytes,
                             (byte *)((long)psStack_10140 + (long)pbVar21));
            write_modes(pAVar32,pTStack_10100,&tile_info,(aom_writer *)&tile_size_bytes,
                        (int)psStack_10190,(int)pAStack_10160);
            iVar12 = aom_stop_encode((aom_writer *)&tile_size_bytes);
            if (iVar12 < 0) {
              aom_internal_error((pAVar32->common).error,AOM_CODEC_ERROR,"Error writing modes");
            }
            uVar15 = uStack_1019c;
            iVar12 = tile_size_bytes;
            puVar33 = (uint8_t *)(_tile_size_bytes & 0xffffffff);
            *(uint8_t **)((long)psStack_10198 + lVar36 + 8) = puVar33;
            if ((uint)uStack_10180 < (uint)tile_size_bytes) {
              *puStack_10120 = uStack_1019c;
              uStack_10180 = (byte *)CONCAT44(uStack_10180._4_4_,tile_size_bytes);
            }
            if (1 < (int)pMStack_10148) {
              iVar29 = tile_size_bytes + -1;
              iVar14 = (pAStack_101a8->common).tiles.width;
              iVar10 = (pAStack_101a8->common).tiles.height;
              if (iVar10 < iVar14) {
                iVar10 = iVar14;
              }
              if (((pAStack_101a8->common).current_frame.frame_type != '\0') && (iVar10 * 4 < 0x101)
                 ) {
                uVar19 = 0;
                if (lVar36 != 0) {
                  uVar4 = **(uint **)((long)psStack_10198 + lVar36 + -0x400);
                  uVar22 = uVar4 >> 0x18 & 0x7f;
                  uVar30 = uVar22 + 1;
                  if (-1 < (int)uVar4) {
                    uVar30 = 1;
                  }
                  uVar19 = 0;
                  if (uVar30 < 0x80) {
                    iVar14 = (int)pbStack_10188 - uVar22;
                    if (-1 < (int)uVar4) {
                      iVar14 = (int)pbStack_10188;
                    }
                    uVar19 = 0;
                    if ((&puStack_10030)[(long)iVar14 * 0x80 + (long)pAStack_10160 * 2] == puVar33)
                    {
                      pbStack_10188 = (byte *)CONCAT44(pbStack_10188._4_4_,iVar29);
                      uStack_100dc = uVar30;
                      iVar14 = bcmp((void *)((&coded_obu_size)
                                             [(long)iVar14 * 0x80 + (long)pAStack_10160 * 2] + 4),
                                    pbVar21 + 4,(size_t)puVar33);
                      uVar19 = uStack_100dc;
                      if (iVar14 != 0) {
                        uVar19 = 0;
                      }
                      iVar29 = (int)pbStack_10188;
                    }
                  }
                }
                if (uVar19 != 0) {
                  iVar29 = (uVar19 | 0xffffff80) << 0x18;
                  iVar12 = 0;
                }
              }
              *(int *)pbVar21 = iVar29;
            }
            uVar13 = uVar13 + (int)psStack_10140 + iVar12;
            lVar36 = lVar36 + 0x400;
            uVar35 = (ulong)(uVar15 + (int)pAStack_10108);
            uVar23 = uVar23 + lStack_100f0;
            pbVar21 = (byte *)((ulong)psStack_10190 & 0xffffffff);
            pAVar20 = pAStack_10108;
          } while (lStack_100e8 != lVar36);
        }
        if (pAStack_10160 != pAVar28) {
          uVar15 = (uVar13 - uVar16) - 4;
          *(uint *)((long)paStack_10170 + (ulong)uVar16) = uVar15;
          if (uStack_10154 <= uVar15) {
            uStack_10154 = uVar15;
          }
        }
        pAVar24 = (AV1_PRIMARY *)((long)pAStack_10160->parallel_cpi + 1);
        psStack_10198 = psStack_10198 + 2;
        uVar23 = uStack_10118 + 0x5d10;
        pAVar32 = pAStack_101a8;
        uVar16 = uVar13;
      } while (pAVar24 != pAVar20);
    }
    av1_accumulate_pack_bs_thread_data(pAVar32,pTStack_10100);
    uVar9 = uStack_100e0;
    paVar25 = paStack_10170;
    _tile_size_bytes = (ulong)uStack_1006c << 0x20;
    tile_info.mi_row_start = 0;
    if (1 < (int)pMStack_10148) {
      iVar12 = remux_tiles(pCStack_100d8,(byte *)((long)paStack_10170 + (ulong)uStack_100e0),
                           uVar13 - uStack_100e0,(uint)uStack_10180,uStack_10154,&tile_size_bytes,
                           &tile_info.mi_row_start);
      uVar13 = iVar12 + uVar9;
    }
    uVar23 = (ulong)uVar13;
    sVar17 = aom_uleb_size_in_bytes(uVar23);
    memmove((byte *)((long)paVar25 + sVar17),paVar25,uVar23);
    coded_obu_size = 0;
    aom_uleb_encode(uVar23,4,(uint8_t *)paVar25,&coded_obu_size);
    aStack_10138.bit_buffer = aStack_10138.bit_buffer + sVar17;
    if (1 < (int)pMStack_10148) {
      aom_wb_overwrite_literal(&aStack_10138,tile_info.mi_row_start + -1,2);
      aom_wb_overwrite_literal(&aStack_10138,tile_size_bytes + -1,2);
    }
    iStack_100a0 = (int)lVar26;
    total_size = (int)sVar17 + uVar13 + iStack_100a0;
  }
  dst = (uint8_t *)((long)psStack_10178 + (ulong)total_size);
LAB_00197848:
  *size = (long)dst - (long)puStack_10110;
  return 0;
}

Assistant:

int av1_pack_bitstream(AV1_COMP *const cpi, uint8_t *dst, size_t dst_size,
                       size_t *size, int *const largest_tile_id) {
  uint8_t *data = dst;
  size_t data_size = dst_size;
  AV1_COMMON *const cm = &cpi->common;
  AV1LevelParams *const level_params = &cpi->ppi->level_params;
  uint32_t obu_header_size = 0;
  uint32_t obu_payload_size = 0;
  FrameHeaderInfo fh_info = { NULL, 0, 0 };
  const uint8_t obu_extension_header =
      cm->temporal_layer_id << 5 | cm->spatial_layer_id << 3 | 0;

  // If no non-zero delta_q has been used, reset delta_q_present_flag
  if (cm->delta_q_info.delta_q_present_flag && cpi->deltaq_used == 0) {
    cm->delta_q_info.delta_q_present_flag = 0;
  }

#if CONFIG_BITSTREAM_DEBUG
  bitstream_queue_reset_write();
#endif

  cpi->frame_header_count = 0;

  // The TD is now written outside the frame encode loop

  // write sequence header obu at each key frame or intra_only frame,
  // preceded by 4-byte size
  if (cm->current_frame.frame_type == INTRA_ONLY_FRAME ||
      cm->current_frame.frame_type == KEY_FRAME) {
    // OBU header is either one or two bytes.
    if (data_size < 2) {
      return AOM_CODEC_ERROR;
    }
    obu_header_size = av1_write_obu_header(
        level_params, &cpi->frame_header_count, OBU_SEQUENCE_HEADER,
        cm->seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/false, 0, data);
    assert(obu_header_size <= 2);
    obu_payload_size = av1_write_sequence_header_obu(
        cm->seq_params, data + obu_header_size, data_size - obu_header_size);
    const size_t length_field_size =
        obu_memmove(obu_header_size, obu_payload_size, data, data_size);
    if (length_field_size == 0) {
      return AOM_CODEC_ERROR;
    }
    if (av1_write_uleb_obu_size(obu_payload_size, data + obu_header_size,
                                length_field_size) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }

    const size_t bytes_written =
        obu_header_size + length_field_size + obu_payload_size;
    data += bytes_written;
    data_size -= bytes_written;
  }

  // write metadata obus before the frame obu that has the show_frame flag set
  if (cm->show_frame) {
    const size_t bytes_written = av1_write_metadata_array(cpi, data, data_size);
    data += bytes_written;
    data_size -= bytes_written;
  }

  const int write_frame_header =
      (cpi->num_tg > 1 || encode_show_existing_frame(cm));
  struct aom_write_bit_buffer saved_wb = { NULL, 0 };
  size_t length_field = 0;
  if (write_frame_header) {
    // Write Frame Header OBU.
    fh_info.frame_header = data;
    // OBU header is either one or two bytes.
    if (data_size < 2) {
      return AOM_CODEC_ERROR;
    }
    obu_header_size = av1_write_obu_header(
        level_params, &cpi->frame_header_count, OBU_FRAME_HEADER,
        cm->seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/true, obu_extension_header, data);
    // TODO: bug 42302568 - Pass data_size - obu_header_size to
    // write_frame_header_obu().
    obu_payload_size = write_frame_header_obu(cpi, &cpi->td.mb.e_mbd, &saved_wb,
                                              data + obu_header_size, 1);

    length_field =
        obu_memmove(obu_header_size, obu_payload_size, data, data_size);
    if (length_field == 0) {
      return AOM_CODEC_ERROR;
    }
    if (av1_write_uleb_obu_size(obu_payload_size, data + obu_header_size,
                                length_field) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }

    fh_info.obu_header_byte_offset = 0;
    fh_info.total_length = obu_header_size + length_field + obu_payload_size;
    // Make sure it is safe to cast fh_info.total_length to uint32_t.
    if (fh_info.total_length > UINT32_MAX) {
      return AOM_CODEC_ERROR;
    }
    data += fh_info.total_length;
    data_size -= fh_info.total_length;
  }

  if (!encode_show_existing_frame(cm)) {
    // Since length_field is determined adaptively after frame header
    // encoding, saved_wb must be adjusted accordingly.
    if (saved_wb.bit_buffer != NULL) {
      saved_wb.bit_buffer += length_field;
    }

    //  Each tile group obu will be preceded by 4-byte size of the tile group
    //  obu
    const size_t bytes_written =
        write_tiles_in_tg_obus(cpi, data, data_size, &saved_wb,
                               obu_extension_header, &fh_info, largest_tile_id);
    data += bytes_written;
    data_size -= bytes_written;
  }
  *size = data - dst;
  (void)data_size;
  return AOM_CODEC_OK;
}